

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

bool __thiscall
TPZTensor<TFad<6,_double>_>::IsZeroTensor(TPZTensor<TFad<6,_double>_> *this,TFad<6,_double> *tol)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  TFadExpr<TFadFuncAbs<TFad<6,_double>_>_> local_a0;
  TFad<6,_double> local_60;
  
  TFad<6,_double>::TFad(&local_60,tol);
  local_60.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  lVar3 = 0;
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 6) break;
    fabs<double,6>(&local_a0,
                   (TFad<6,_double> *)
                   ((long)((this->fData).super_TPZVec<TFad<6,_double>_>.fStore)->dx_ + lVar3 + -0x10
                   ));
    lVar3 = lVar3 + 0x40;
    uVar1 = uVar2 + 1;
  } while (ABS(local_a0.fadexpr_.expr_.val_) <= local_60.val_);
  return 5 < uVar2;
}

Assistant:

bool IsZeroTensor(T tol = 1.e-9) const {
        REAL realTol = TPZExtractVal::val(tol);
        for (unsigned int i = 0; i < 6; ++i) {
            if (fabs(this->fData[i]) > realTol) {
                return false;
            }
        }
        return true;
    }